

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_array_sort(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int64_t iVar1;
  JSValueUnion JVar2;
  JSAtomStruct *pJVar3;
  JSRuntime *pJVar4;
  int iVar5;
  void *pvVar6;
  size_t sVar7;
  ulong uVar8;
  JSRefCountHeader *p;
  ulong uVar9;
  JSValue *pJVar10;
  size_t *psVar11;
  ulong uVar12;
  long lVar13;
  undefined8 *puVar14;
  JSValue JVar15;
  JSValue JVar16;
  int64_t len;
  size_t slack;
  array_sort_context asc;
  void *local_80;
  JSValueUnion local_78;
  int64_t local_70;
  long local_68;
  size_t local_60;
  ulong local_58;
  JSContext *local_50;
  undefined8 local_48;
  JSValueUnion local_40;
  int64_t iStack_38;
  
  local_48 = 0;
  local_40 = argv->u;
  iStack_38 = argv->tag;
  local_50 = ctx;
  if ((int)iStack_38 == 3) {
LAB_00162fd4:
    JVar16 = JS_ToObject(ctx,this_val);
    iVar5 = js_get_length64(ctx,(int64_t *)&local_60,JVar16);
    if (iVar5 != 0) goto LAB_00162fff;
    local_78 = JVar16.u;
    if ((long)local_60 < 1) {
      local_68 = 0;
      uVar12 = 0;
      local_80 = (void *)0x0;
    }
    else {
      uVar8 = 0;
      local_80 = (void *)0x0;
      uVar9 = 0;
      uVar12 = 0;
      local_68 = 0;
      lVar13 = 0;
      do {
        if (uVar9 <= uVar12) {
          uVar9 = uVar9 + (uVar9 >> 1) + 0x1f & 0xfffffffffffffff0;
          pvVar6 = js_realloc2(ctx,local_80,uVar9 << 5,&local_58);
          if (pvVar6 == (void *)0x0) goto LAB_00163174;
          uVar9 = (local_58 >> 5) + uVar9;
          local_80 = pvVar6;
        }
        pJVar10 = (JSValue *)(uVar12 * 0x20 + (long)local_80);
        iVar5 = JS_TryGetPropertyInt64(ctx,JVar16,lVar13,pJVar10);
        if (iVar5 < 0) goto LAB_00163174;
        if (iVar5 != 0) {
          if ((int)pJVar10->tag == 3) {
            local_68 = local_68 + 1;
          }
          else {
            pJVar10[1].u.float64 = 0.0;
            pJVar10[1].tag = lVar13;
            uVar12 = uVar12 + 1;
          }
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < (long)local_60);
    }
    rqsort(local_80,uVar12,0x20,js_array_cmp_generic,&local_50);
    if ((int)local_48 == 0) {
      if (uVar12 != 0) {
        psVar11 = (size_t *)((long)local_80 + 0x18);
        sVar7 = 0;
        do {
          pJVar3 = (JSAtomStruct *)psVar11[-1];
          if ((pJVar3 != (JSAtomStruct *)0x0) &&
             (iVar5 = (pJVar3->header).ref_count, (pJVar3->header).ref_count = iVar5 + -1, iVar5 < 2
             )) {
            pJVar4 = ctx->rt;
            if (*(ulong *)&pJVar3->field_0x4 < 0x4000000000000000) {
              (*(pJVar4->mf).js_free)(&pJVar4->malloc_state,pJVar3);
            }
            else {
              JS_FreeAtomStruct(pJVar4,pJVar3);
            }
          }
          pJVar10 = (JSValue *)(psVar11 + -3);
          JVar15 = *pJVar10;
          if (sVar7 == *psVar11) {
            if ((0xfffffff4 < (uint)psVar11[-2]) &&
               (iVar5 = *(pJVar10->u).ptr, *(int *)(pJVar10->u).ptr = iVar5 + -1, iVar5 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar15);
            }
          }
          else {
            iVar5 = JS_SetPropertyInt64(ctx,JVar16,sVar7,*pJVar10);
            if (iVar5 < 0) {
              uVar8 = sVar7 + 1;
              goto LAB_00163174;
            }
          }
          sVar7 = sVar7 + 1;
          psVar11 = psVar11 + 4;
        } while (uVar12 != sVar7);
      }
      (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,local_80);
      local_70 = JVar16.tag;
      sVar7 = uVar12;
      if (0 < local_68) {
        sVar7 = local_68 + uVar12;
        do {
          iVar5 = JS_SetPropertyInt64(ctx,JVar16,uVar12,(JSValue)(ZEXT816(3) << 0x40));
          if (iVar5 < 0) goto LAB_0016300f;
          uVar12 = uVar12 + 1;
          local_68 = local_68 + -1;
        } while (local_68 != 0);
      }
      if ((long)sVar7 < (long)local_60) {
        do {
          iVar5 = JS_DeletePropertyInt64(ctx,JVar16,sVar7,0x4000);
          if (iVar5 < 0) goto LAB_0016300f;
          sVar7 = sVar7 + 1;
        } while (local_60 != sVar7);
      }
      uVar9 = (ulong)local_78.ptr & 0xffffffff00000000;
      uVar12 = (ulong)local_78.ptr & 0xffffffff;
      goto LAB_0016303d;
    }
    uVar8 = 0;
LAB_00163174:
    lVar13 = uVar12 - uVar8;
    if (uVar8 <= uVar12 && lVar13 != 0) {
      puVar14 = (undefined8 *)((long)local_80 + uVar8 * 0x20 + 0x10);
      do {
        iVar1 = puVar14[-1];
        if (0xfffffff4 < (uint)iVar1) {
          JVar2 = (JSValueUnion)((JSValueUnion *)(puVar14 + -2))->ptr;
          iVar5 = *JVar2.ptr;
          *(int *)JVar2.ptr = iVar5 + -1;
          if (iVar5 < 2) {
            JVar15.tag = iVar1;
            JVar15.u.ptr = JVar2.ptr;
            __JS_FreeValueRT(ctx->rt,JVar15);
          }
        }
        pJVar3 = (JSAtomStruct *)*puVar14;
        if ((pJVar3 != (JSAtomStruct *)0x0) &&
           (iVar5 = (pJVar3->header).ref_count, (pJVar3->header).ref_count = iVar5 + -1, iVar5 < 2))
        {
          pJVar4 = ctx->rt;
          if (*(ulong *)&pJVar3->field_0x4 < 0x4000000000000000) {
            (*(pJVar4->mf).js_free)(&pJVar4->malloc_state,pJVar3);
          }
          else {
            JS_FreeAtomStruct(pJVar4,pJVar3);
          }
        }
        puVar14 = puVar14 + 4;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
  }
  else {
    iVar5 = check_function(ctx,*argv);
    if (iVar5 == 0) {
      local_48 = CONCAT44(1,(int)local_48);
      goto LAB_00162fd4;
    }
    JVar16 = (JSValue)(ZEXT816(3) << 0x40);
LAB_00162fff:
    local_80 = (void *)0x0;
  }
  (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,local_80);
LAB_0016300f:
  local_70 = 6;
  if ((0xfffffff4 < (uint)JVar16.tag) &&
     (iVar5 = *JVar16.u.ptr, *(int *)JVar16.u.ptr = iVar5 + -1, iVar5 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar16);
  }
  uVar12 = 0;
  uVar9 = 0;
LAB_0016303d:
  JVar16.u.ptr = (void *)(uVar12 | uVar9);
  JVar16.tag = local_70;
  return JVar16;
}

Assistant:

static JSValue js_array_sort(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    struct array_sort_context asc = { ctx, 0, 0, argv[0] };
    JSValue obj = JS_UNDEFINED;
    ValueSlot *array = NULL;
    size_t array_size = 0, pos = 0, n = 0;
    int64_t i, len, undefined_count = 0;
    int present;

    if (!JS_IsUndefined(asc.method)) {
        if (check_function(ctx, asc.method))
            goto exception;
        asc.has_method = 1;
    }
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    /* XXX: should special case fast arrays */
    for (i = 0; i < len; i++) {
        if (pos >= array_size) {
            size_t new_size, slack;
            ValueSlot *new_array;
            new_size = (array_size + (array_size >> 1) + 31) & ~15;
            new_array = js_realloc2(ctx, array, new_size * sizeof(*array), &slack);
            if (new_array == NULL)
                goto exception;
            new_size += slack / sizeof(*new_array);
            array = new_array;
            array_size = new_size;
        }
        present = JS_TryGetPropertyInt64(ctx, obj, i, &array[pos].val);
        if (present < 0)
            goto exception;
        if (present == 0)
            continue;
        if (JS_IsUndefined(array[pos].val)) {
            undefined_count++;
            continue;
        }
        array[pos].str = NULL;
        array[pos].pos = i;
        pos++;
    }
    rqsort(array, pos, sizeof(*array), js_array_cmp_generic, &asc);
    if (asc.exception)
        goto exception;

    /* XXX: should special case fast arrays */
    while (n < pos) {
        if (array[n].str)
            JS_FreeValue(ctx, JS_MKPTR(JS_TAG_STRING, array[n].str));
        if (array[n].pos == n) {
            JS_FreeValue(ctx, array[n].val);
        } else {
            if (JS_SetPropertyInt64(ctx, obj, n, array[n].val) < 0) {
                n++;
                goto exception;
            }
        }
        n++;
    }
    js_free(ctx, array);
    for (i = n; undefined_count-- > 0; i++) {
        if (JS_SetPropertyInt64(ctx, obj, i, JS_UNDEFINED) < 0)
            goto fail;
    }
    for (; i < len; i++) {
        if (JS_DeletePropertyInt64(ctx, obj, i, JS_PROP_THROW) < 0)
            goto fail;
    }
    return obj;

exception:
    for (; n < pos; n++) {
        JS_FreeValue(ctx, array[n].val);
        if (array[n].str)
            JS_FreeValue(ctx, JS_MKPTR(JS_TAG_STRING, array[n].str));
    }
    js_free(ctx, array);
fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}